

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

void __thiscall MercuryJson::JSON::exec_stage2(JSON *this)

{
  JsonValue *pJVar1;
  type *in_RDI;
  thread *thread;
  thread *__end1;
  thread *__begin1;
  thread (*__range1) [4];
  char ch;
  size_t i;
  thread parse_str_threads [4];
  size_t in_stack_00000128;
  char in_stack_00000137;
  char *in_stack_00000138;
  JSON *in_stack_00000140;
  thread *in_stack_ffffffffffffff28;
  thread *in_stack_ffffffffffffff30;
  thread *local_c0;
  unsigned_long *in_stack_ffffffffffffff58;
  thread *this_00;
  thread *local_88;
  JSON *in_stack_ffffffffffffff90;
  thread *ptVar2;
  ulong local_30;
  thread local_28 [4];
  thread local_8;
  
  this_00 = &local_8;
  ptVar2 = local_28;
  do {
    local_88 = ptVar2;
    std::thread::thread((thread *)0x132634);
    ptVar2 = local_88 + 1;
  } while (local_88 + 1 != this_00);
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    std::thread::
    thread<void(MercuryJson::JSON::*)(unsigned_long),MercuryJson::JSON*,unsigned_long&,void>
              (this_00,in_RDI,(JSON **)local_88,in_stack_ffffffffffffff58);
    std::thread::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::thread::~thread((thread *)0x1326e7);
  }
  pJVar1 = _parse_value(in_stack_ffffffffffffff90);
  in_RDI[0xc] = (type)pJVar1;
  if (*(char *)(*in_RDI + *(long *)in_RDI[4]) != '\0') {
    _error(in_stack_00000140,in_stack_00000138,in_stack_00000137,in_stack_00000128);
  }
  for (ptVar2 = local_28; ptVar2 != &local_8; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  aligned_free<unsigned_long>((unsigned_long *)0x1327ec);
  in_RDI[3] = 0;
  local_c0 = &local_8;
  do {
    local_c0 = local_c0 + -1;
    std::thread::~thread((thread *)0x132824);
  } while (local_c0 != local_28);
  return;
}

Assistant:

void JSON::exec_stage2() {
//        std::chrono::time_point<std::chrono::steady_clock> start_time;
//        std::chrono::duration<double> runtime;
#if PARSE_STR_NUM_THREADS
//        start_time = std::chrono::steady_clock::now();
        std::thread parse_str_threads[PARSE_STR_NUM_THREADS];
        for (size_t i = 0; i < PARSE_STR_NUM_THREADS; ++i)
            parse_str_threads[i] = std::thread(&JSON::_thread_parse_str, this, i);
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("thread spawn: %.6lf\n", runtime.count());
#endif

//        start_time = std::chrono::steady_clock::now();
#if SHIFT_REDUCE_PARSER
        document = _shift_reduce_parsing();  // final index is '\0'
#else
        document = _parse_value();
#endif
        char ch = input[*idx_ptr];
        if (ch != '\0') _error("file end", ch, *idx_ptr);
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("parse document: %.6lf\n", runtime.count());
#if PARSE_STR_NUM_THREADS
//        start_time = std::chrono::steady_clock::now();
        for (std::thread &thread : parse_str_threads)
            thread.join();
//        runtime = std::chrono::steady_clock::now() - start_time;
//        printf("wait join: %.6lf\n", runtime.count());
#endif
        aligned_free(indices);
        indices = nullptr;
    }